

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O1

_Bool nbt_map(nbt_node *tree,nbt_visitor_t v,void *aux)

{
  _Bool _Var1;
  nbt_list *pnVar2;
  _Bool _Var3;
  list_head *plVar4;
  bool bVar5;
  
  if (v == (nbt_visitor_t)0x0) {
    __assert_fail("v",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xc9,"_Bool nbt_map(nbt_node *, nbt_visitor_t, void *)");
  }
  _Var3 = true;
  if (tree != (nbt_node *)0x0) {
    _Var1 = (*v)(tree,aux);
    if (_Var1) {
      if (tree->type == TAG_COMPOUND) {
        pnVar2 = (tree->payload).tag_list;
        for (plVar4 = (pnVar2->entry).flink; bVar5 = plVar4 != &pnVar2->entry, bVar5;
            plVar4 = plVar4->flink) {
          _Var1 = nbt_map((nbt_node *)plVar4[-1].flink,v,aux);
          if (!_Var1) {
            if (bVar5) goto LAB_0010475d;
            break;
          }
          pnVar2 = (tree->payload).tag_list;
        }
      }
      if (tree->type == TAG_LIST) {
        pnVar2 = (tree->payload).tag_list;
        for (plVar4 = (pnVar2->entry).flink; bVar5 = plVar4 != &pnVar2->entry, bVar5;
            plVar4 = plVar4->flink) {
          _Var1 = nbt_map((nbt_node *)plVar4[-1].flink,v,aux);
          if (!_Var1) {
            if (!bVar5) {
              return true;
            }
            goto LAB_0010475d;
          }
          pnVar2 = (tree->payload).tag_list;
        }
      }
    }
    else {
LAB_0010475d:
      _Var3 = false;
    }
  }
  return _Var3;
}

Assistant:

bool nbt_map(nbt_node* tree, nbt_visitor_t v, void* aux)
{
    assert(v);

    if(tree == NULL)  return true;
    if(!v(tree, aux)) return false;

    /* And if the item is a list or compound, recurse through each of their elements. */
    if(tree->type == TAG_COMPOUND)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_compound->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }
    
    if(tree->type == TAG_LIST)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_list->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }

    return true;
}